

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

int scalar_decode(scalar *out,uint8_t *in,int bits)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar5 = 0;
  bVar7 = false;
  iVar3 = 0;
  bVar2 = 0;
  do {
    iVar4 = 0;
    uVar6 = 0;
    if (0 < bits) {
      do {
        if (iVar3 == 0) {
          bVar2 = *in;
          in = in + 1;
          iVar3 = 8;
        }
        iVar1 = bits - iVar4;
        if (iVar3 <= bits - iVar4) {
          iVar1 = iVar3;
        }
        uVar6 = uVar6 | (uint)(*(byte *)((long)kInverseNTTRoots + (long)iVar1 + 0xff) & bVar2) <<
                        ((byte)iVar4 & 0x1f);
        bVar2 = bVar2 >> ((byte)iVar1 & 0x1f);
        iVar3 = iVar3 - iVar1;
        iVar4 = iVar1 + iVar4;
      } while (iVar4 < bits);
    }
    if (0xd00 < (uVar6 & 0xffff)) break;
    out->c[uVar5] = (uint16_t)uVar6;
    bVar7 = 0xfe < uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x100);
  return (uint)bVar7;
}

Assistant:

static int scalar_decode(scalar *out, const uint8_t *in, int bits) {
  assert(bits <= (int)sizeof(*out->c) * 8 && bits != 1);

  uint8_t in_byte = 0;
  int in_byte_bits_left = 0;

  for (int i = 0; i < DEGREE; i++) {
    uint16_t element = 0;
    int element_bits_done = 0;

    while (element_bits_done < bits) {
      if (in_byte_bits_left == 0) {
        in_byte = *in;
        in++;
        in_byte_bits_left = 8;
      }

      int chunk_bits = bits - element_bits_done;
      if (chunk_bits > in_byte_bits_left) {
        chunk_bits = in_byte_bits_left;
      }

      element |= (in_byte & kMasks[chunk_bits - 1]) << element_bits_done;
      in_byte_bits_left -= chunk_bits;
      in_byte >>= chunk_bits;

      element_bits_done += chunk_bits;
    }

    // An element is only out of range in the case of invalid input, in which
    // case it is okay to leak the comparison.
    if (constant_time_declassify_int(element >= kPrime)) {
      return 0;
    }
    out->c[i] = element;
  }

  return 1;
}